

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport_p.h
# Opt level: O1

void __thiscall KDReports::HeaderMap::updateTextValue(HeaderMap *this,QString *id,QString *newValue)

{
  QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>
  *pQVar1;
  TextDocument *this_00;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  
  pQVar1 = (this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>).d.d;
  if (pQVar1 == (QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>
                 *)0x0) {
    p_Var2 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  while( true ) {
    pQVar1 = (this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>).d.d;
    p_Var3 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar1 == (QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>
                   *)0x0) {
      p_Var3 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var2 == p_Var3) break;
    this_00 = Header::doc((Header *)p_Var2[1]._M_parent);
    TextDocument::updateTextValue(this_00,id,newValue);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return;
}

Assistant:

void updateTextValue(const QString &id, const QString &newValue)
    {
        for (const_iterator it = constBegin(); it != constEnd(); ++it) {
            it.value()->doc().updateTextValue(id, newValue);
        }
    }